

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::TableFunctionBinder::BindColumnReference
          (BindResult *__return_storage_ptr__,TableFunctionBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  Binder *pBVar1;
  optional_idx oVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  BaseExpression *pBVar5;
  ColumnRefExpression *this_00;
  LambdaRefExpression *expr;
  DummyBinding *this_01;
  BinderException *pBVar6;
  ParameterNotResolvedException *this_02;
  pointer *__ptr;
  undefined7 in_register_00000081;
  Expression *local_228;
  optional_idx local_220;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_218;
  undefined1 local_210 [32];
  string result_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  column_names;
  string column_name;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  ErrorData local_b0;
  
  pBVar5 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator->(expr_ptr)->super_BaseExpression;
  this_00 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar5);
  bVar4 = ColumnRefExpression::IsQualified(this_00);
  oVar2.index = CONCAT71(in_register_00000081,root_expression);
  if (!bVar4) {
    local_220.index._0_4_ = (int)CONCAT71(in_register_00000081,root_expression);
    (*(this_00->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              (&column_name,this_00);
    LambdaRefExpression::FindMatchingBinding
              ((LambdaRefExpression *)&result_name,&(this->super_ExpressionBinder).lambda_bindings,
               &column_name);
    _Var3 = result_name._M_dataplus;
    if (result_name._M_dataplus._M_p == (pointer)0x0) {
      pBVar1 = (this->super_ExpressionBinder).binder;
      if ((pBVar1->macro_binding).ptr != (DummyBinding *)0x0) {
        this_01 = optional_ptr<duckdb::DummyBinding,_true>::operator->(&pBVar1->macro_binding);
        bVar4 = Binding::HasMatchingBinding(&this_01->super_Binding,&column_name);
        if (bVar4) {
          this_02 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
          ParameterNotResolvedException::ParameterNotResolvedException(this_02);
          __cxa_throw(this_02,&ParameterNotResolvedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
      }
    }
    else {
      pBVar5 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)&result_name)->super_BaseExpression;
      expr = BaseExpression::Cast<duckdb::LambdaRefExpression>(pBVar5);
      BindLambdaReference(__return_storage_ptr__,this,expr,depth);
    }
    if (result_name._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)result_name._M_dataplus._M_p + 8))();
    }
    ::std::__cxx11::string::~string((string *)&column_name);
    oVar2.index = local_220.index;
    if (_Var3._M_p != (pointer)0x0) {
      return __return_storage_ptr__;
    }
  }
  local_220.index = (this_00->super_ParsedExpression).super_BaseExpression.query_location.index;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&column_names,
           &(this_00->column_names).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  ::std::__cxx11::string::string((string *)&column_name,".",(allocator *)local_210);
  StringUtil::Join((string *)&result_name,&column_names,(string *)&column_name);
  ::std::__cxx11::string::~string((string *)&column_name);
  if ((this->table_function_name)._M_string_length != 0) {
    ::std::__cxx11::string::string((string *)local_210,"error",(allocator *)&local_228);
    ErrorData::ErrorData(&local_b0,(string *)local_210);
    ExpressionBinder::BindCorrelatedColumns
              ((BindResult *)&column_name,&this->super_ExpressionBinder,expr_ptr,&local_b0);
    ErrorData::~ErrorData(&local_b0);
    ::std::__cxx11::string::~string((string *)local_210);
    if ((char)column_name._M_string_length == '\0') {
      pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)local_210,
                 "Table function \"%s\" does not support lateral join column parameters - cannot use column \"%s\" in this context.\nThe function only supports literals as parameters."
                 ,(allocator *)&local_228);
      ::std::__cxx11::string::string((string *)&local_d0,(string *)&this->table_function_name);
      ::std::__cxx11::string::string((string *)&local_f0,(string *)&result_name);
      BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                (pBVar6,local_220,(string *)local_210,&local_d0,&local_f0);
      __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    BindResult::~BindResult((BindResult *)&column_name);
  }
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  back(&column_names);
  ExpressionBinder::GetSQLValueFunction((ExpressionBinder *)local_210,(string *)this);
  if ((long *)local_210._0_8_ == (long *)0x0) {
    if ((this->table_function_name)._M_string_length == 0) {
      pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&column_name,
                 "Failed to bind \"%s\" - COLUMNS expression can only contain lambda parameters",
                 (allocator *)&local_228);
      ::std::__cxx11::string::string((string *)&local_110,(string *)&result_name);
      BinderException::BinderException<std::__cxx11::string>
                (pBVar6,local_220,&column_name,&local_110);
      __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string((string *)&local_130,(string *)&result_name);
    Value::Value((Value *)&column_name,&local_130);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
              ((duckdb *)&local_228,(Value *)&column_name);
    local_218._M_head_impl = local_228;
    local_228 = (Expression *)0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_218);
    if (local_218._M_head_impl != (Expression *)0x0) {
      (*((local_218._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_218._M_head_impl = (Expression *)0x0;
    if (local_228 != (Expression *)0x0) {
      (**(code **)(*(long *)local_228 + 8))();
    }
    local_228 = (Expression *)0x0;
    Value::~Value((Value *)&column_name);
    ::std::__cxx11::string::~string((string *)&local_130);
  }
  else {
    (*(this->super_ExpressionBinder)._vptr_ExpressionBinder[5])
              (__return_storage_ptr__,this,local_210,depth,oVar2.index & 0xff);
  }
  if ((long *)local_210._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_210._0_8_ + 8))();
  }
  ::std::__cxx11::string::~string((string *)&result_name);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&column_names);
  return __return_storage_ptr__;
}

Assistant:

BindResult TableFunctionBinder::BindColumnReference(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth,
                                                    bool root_expression) {
	// try binding as a lambda parameter
	auto &col_ref = expr_ptr->Cast<ColumnRefExpression>();
	if (!col_ref.IsQualified()) {
		auto column_name = col_ref.GetName();
		auto lambda_ref = LambdaRefExpression::FindMatchingBinding(lambda_bindings, column_name);
		if (lambda_ref) {
			return BindLambdaReference(lambda_ref->Cast<LambdaRefExpression>(), depth);
		}
		if (binder.macro_binding && binder.macro_binding->HasMatchingBinding(column_name)) {
			throw ParameterNotResolvedException();
		}
	}
	auto query_location = col_ref.GetQueryLocation();
	auto column_names = col_ref.column_names;
	auto result_name = StringUtil::Join(column_names, ".");
	if (!table_function_name.empty()) {
		// check if this is a lateral join column/parameter
		auto result = BindCorrelatedColumns(expr_ptr, ErrorData("error"));
		if (!result.HasError()) {
			// it is a lateral join parameter - this is not supported in this type of table function
			throw BinderException(query_location,
			                      "Table function \"%s\" does not support lateral join column parameters - cannot use "
			                      "column \"%s\" in this context.\nThe function only supports literals as parameters.",
			                      table_function_name, result_name);
		}
	}

	auto value_function = ExpressionBinder::GetSQLValueFunction(column_names.back());
	if (value_function) {
		return BindExpression(value_function, depth, root_expression);
	}
	if (table_function_name.empty()) {
		throw BinderException(query_location,
		                      "Failed to bind \"%s\" - COLUMNS expression can only contain lambda parameters",
		                      result_name);
	}

	return BindResult(make_uniq<BoundConstantExpression>(Value(result_name)));
}